

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void expandFormatArguments<String,int,String,String>
               (vector<String,_std::allocator<String>_> *data,String *arg,int *rest,String *rest_1,
               String *rest_2)

{
  value_type vStack_48;
  
  std::__cxx11::string::string((string *)&vStack_48,(string *)arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,&vStack_48);
  std::__cxx11::string::~string((string *)&vStack_48);
  expandFormatArguments<int,String,String>(data,rest,rest_1,rest_2);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}